

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

UString * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::manifestJson
          (Interpreter *this,LocationRange *loc,bool multiline,UString *indent)

{
  Identifier *pIVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppHVar7;
  undefined8 uVar8;
  mapped_type *ppIVar9;
  size_type sVar10;
  Frame *pFVar11;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  byte in_CL;
  Interpreter *in_RDX;
  Stack *in_RSI;
  LocationRange *in_RDI;
  undefined8 in_R8;
  UString *str;
  UString vstr;
  AST *body;
  pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>
  *f_1;
  iterator __end5_1;
  iterator __begin5_1;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  *__range5_1;
  char32_t *prefix_1;
  UString indent2_1;
  Identifier **f;
  iterator __end4;
  iterator __begin4;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *__range4;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  fields;
  HeapObject *obj;
  UString element;
  LocationRange tloc;
  HeapThunk *thunk;
  iterator __end5;
  iterator __begin5;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *__range5;
  UString indent2;
  char32_t *prefix;
  HeapArray *arr;
  UStringStream ss;
  uint in_stack_000032a4;
  AST *in_stack_000032a8;
  Interpreter *in_stack_000032b0;
  LocationRange *in_stack_fffffffffffffc18;
  LocationRange *in_stack_fffffffffffffc20;
  Interpreter *in_stack_fffffffffffffc28;
  char32_t *in_stack_fffffffffffffc40;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc48;
  allocator<char> *in_stack_fffffffffffffc50;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc58;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc80;
  UString *in_stack_fffffffffffffc88;
  HeapObject *in_stack_fffffffffffffca0;
  LocationRange *in_stack_fffffffffffffca8;
  undefined1 manifesting;
  Interpreter *in_stack_fffffffffffffcb0;
  Interpreter *in_stack_fffffffffffffcb8;
  HeapThunk *in_stack_fffffffffffffce8;
  undefined8 *in_stack_fffffffffffffcf0;
  Interpreter *self;
  LocationRange *loc_00;
  Identifier *in_stack_fffffffffffffd20;
  HeapObject *in_stack_fffffffffffffd28;
  LocationRange *in_stack_fffffffffffffd30;
  Interpreter *in_stack_fffffffffffffd38;
  _Self local_268;
  _Self local_260;
  undefined1 *local_258;
  char32_t *local_250;
  reference local_228;
  _Self local_220;
  _Self local_218 [4];
  double in_stack_fffffffffffffe08;
  undefined1 local_1d8 [48];
  pointer local_1a8;
  undefined1 local_19a;
  string local_178 [96];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  HeapThunk *local_a8;
  HeapThunk **local_a0;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_98;
  LocationRange *local_90;
  char32_t *local_68;
  pointer local_50;
  UString *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar3 = in_CL & 1;
  loc_00 = in_RDI;
  UStringStream::UStringStream((UStringStream *)0x224512);
  uVar5 = (ulong)*(uint *)&in_RSI[1].stack.
                           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
  switch(uVar5) {
  case 0:
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
    break;
  case 1:
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
    break;
  case 2:
    jsonnet_unparse_number_abi_cxx11_(in_stack_fffffffffffffe08);
    decode_utf8((string *)in_stack_fffffffffffffc58);
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_178);
    break;
  case 0x10:
    local_50 = in_RSI[1].stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)&local_50->location);
    if (sVar6 == 0) {
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
    }
    else {
      local_68 = L"[";
      if ((bVar3 & 1) != 0) {
        local_68 = L"[\n";
      }
      if ((bVar3 & 1) == 0) {
        std::__cxx11::u32string::u32string(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      else {
        std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      }
      local_90 = &local_50->location;
      local_98._M_current =
           (HeapThunk **)
           std::
           vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)in_stack_fffffffffffffc18);
      local_a0 = (HeapThunk **)
                 std::
                 vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffc18);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                                 *)in_stack_fffffffffffffc20,
                                (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                                 *)in_stack_fffffffffffffc18), bVar4) {
        ppHVar7 = __gnu_cxx::
                  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  ::operator*(&local_98);
        local_a8 = *ppHVar7;
        self = in_RDX;
        if (local_a8->body != (AST *)0x0) {
          self = (Interpreter *)&local_a8->body->location;
        }
        LocationRange::LocationRange(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (((local_a8->super_HeapEntity).field_0xa & 1) == 0) {
          Stack::newCall(in_RSI,loc_00,(HeapEntity *)in_RDI,(HeapObject *)self,
                         (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (BindingFrame *)in_stack_fffffffffffffce8);
          pFVar11 = Stack::top((Stack *)0x224854);
          aVar2 = (anon_union_8_3_4e909c26_for_v)
                  in_RSI[1].stack.
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(pointer *)&pFVar11->val =
               in_RSI[1].stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar11->val).v = aVar2;
          Stack::size((Stack *)0x224885);
          evaluate(in_stack_000032b0,in_stack_000032a8,in_stack_000032a4);
        }
        else {
          local_f8 = 0;
          uStack_f0 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          in_stack_fffffffffffffcf0 = &local_118;
          in_stack_fffffffffffffce8 = local_a8;
          std::
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)0x224747);
          Stack::newCall(in_RSI,loc_00,(HeapEntity *)in_RDI,(HeapObject *)self,
                         (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (BindingFrame *)in_stack_fffffffffffffce8);
          std::
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)0x224781);
          pFVar11 = Stack::top((Stack *)0x224792);
          *(pointer *)&pFVar11->val =
               in_RSI[1].stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar11->val).v =
               (anon_union_8_3_4e909c26_for_v)
               in_RSI[1].stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          in_RSI[1].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&local_a8->content;
          in_RSI[1].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_a8->content).v;
        }
        manifestJson(in_RDX,(LocationRange *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                     SUB81((ulong)in_R8 >> 0x38,0),in_stack_ffffffffffffffd0);
        pFVar11 = Stack::top((Stack *)0x224904);
        aVar2 = (pFVar11->val).v;
        in_RSI[1].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pFVar11->val;
        in_RSI[1].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aVar2;
        Stack::pop((Stack *)in_stack_fffffffffffffc20);
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18)
        ;
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
        if ((bVar3 & 1) == 0) {
          local_68 = L", ";
        }
        else {
          local_68 = L",\n";
        }
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffffc20);
        LocationRange::~LocationRange((LocationRange *)0x2249cf);
        __gnu_cxx::
        __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::operator++(&local_98);
      }
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffc20);
    }
    break;
  case 0x11:
    local_19a = 1;
    uVar8 = __cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
              );
    makeError(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->file);
    local_19a = 0;
    __cxa_throw(uVar8,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  case 0x12:
    local_1a8 = in_RSI[1].stack.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    runInvariants(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    manifesting = (undefined1)((ulong)in_stack_fffffffffffffca8 >> 0x38);
    std::
    map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
    ::map((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
           *)0x224cce);
    objectFields(in_stack_fffffffffffffcb8,(HeapObject *)in_stack_fffffffffffffcb0,(bool)manifesting
                );
    local_218[0]._M_node =
         (_Base_ptr)
         std::
         set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         ::begin((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                  *)in_stack_fffffffffffffc18);
    local_220._M_node =
         (_Base_ptr)
         std::
         set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         ::end((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)in_stack_fffffffffffffc18);
    while (bVar4 = std::operator!=(local_218,&local_220), bVar4) {
      local_228 = std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator*
                            ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)
                             0x224d7d);
      pIVar1 = *local_228;
      ppIVar9 = std::
                map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                              *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      *ppIVar9 = pIVar1;
      std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator++
                ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)
                 in_stack_fffffffffffffc20);
    }
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x224d52);
    sVar10 = std::
             map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
             ::size((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                     *)0x224dfb);
    if (sVar10 == 0) {
      UStringStream::operator<<
                ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18);
    }
    else {
      if ((bVar3 & 1) == 0) {
        std::__cxx11::u32string::u32string(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      else {
        std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      }
      local_250 = L"{";
      if ((bVar3 & 1) != 0) {
        local_250 = L"{\n";
      }
      local_258 = local_1d8;
      local_260._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
           ::begin((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                    *)in_stack_fffffffffffffc18);
      local_268._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
           ::end((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                  *)in_stack_fffffffffffffc18);
      while (bVar4 = std::operator!=(&local_260,&local_268), bVar4) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>
                     *)in_stack_fffffffffffffc20);
        objectIndex(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                    in_stack_fffffffffffffd20,(uint)(uVar5 >> 0x20));
        pFVar11 = Stack::top((Stack *)0x224f46);
        aVar2 = (anon_union_8_3_4e909c26_for_v)
                in_RSI[1].stack.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(pointer *)&pFVar11->val =
             in_RSI[1].stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar11->val).v = aVar2;
        Stack::size((Stack *)0x224f6d);
        evaluate(in_stack_000032b0,in_stack_000032a8,in_stack_000032a4);
        manifestJson(in_RDX,(LocationRange *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                     SUB81((ulong)in_R8 >> 0x38,0),in_stack_ffffffffffffffd0);
        pFVar11 = Stack::top((Stack *)0x224fcf);
        aVar2 = (pFVar11->val).v;
        in_RSI[1].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pFVar11->val;
        in_RSI[1].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aVar2;
        Stack::pop((Stack *)in_stack_fffffffffffffc20);
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18)
        ;
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
        jsonnet_string_unparse
                  (in_stack_fffffffffffffc88,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(char32_t *)in_stack_fffffffffffffc18)
        ;
        UStringStream::operator<<
                  ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffffc20);
        if ((bVar3 & 1) == 0) {
          local_250 = L", ";
        }
        else {
          local_250 = L",\n";
        }
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffffc20);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>
                      *)in_stack_fffffffffffffc20);
      }
      this_00 = &UStringStream::operator<<
                           ((UStringStream *)in_stack_fffffffffffffc20,
                            (char32_t *)in_stack_fffffffffffffc18)->buf;
      in_stack_fffffffffffffc18 =
           (LocationRange *)
           UStringStream::operator<<((UStringStream *)this_00,(UString *)in_stack_fffffffffffffc18);
      UStringStream::operator<<((UStringStream *)this_00,(char32_t *)in_stack_fffffffffffffc18);
      std::__cxx11::u32string::~u32string(this_00);
    }
    std::
    map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
            *)0x2251c2);
    break;
  case 0x13:
    jsonnet_string_unparse
              (in_stack_fffffffffffffc88,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffffc20,(UString *)in_stack_fffffffffffffc18);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffc20);
  }
  UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffffc18);
  UStringStream::~UStringStream((UStringStream *)0x225277);
  return (UString *)loc_00;
}

Assistant:

UString manifestJson(const LocationRange &loc, bool multiline, const UString &indent)
    {
        // Printing fields means evaluating and binding them, which can trigger
        // garbage collection.

        UStringStream ss;
        switch (scratch.t) {
            case Value::ARRAY: {
                HeapArray *arr = static_cast<HeapArray *>(scratch.v.h);
                if (arr->elements.size() == 0) {
                    ss << U"[ ]";
                } else {
                    const char32_t *prefix = multiline ? U"[\n" : U"[";
                    UString indent2 = multiline ? indent + U"   " : indent;
                    for (auto *thunk : arr->elements) {
                        LocationRange tloc = thunk->body == nullptr ? loc : thunk->body->location;
                        if (thunk->filled) {
                            stack.newCall(loc, thunk, nullptr, 0, BindingFrame{});
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            scratch = thunk->content;
                        } else {
                            stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            evaluate(thunk->body, stack.size());
                        }
                        auto element = manifestJson(tloc, multiline, indent2);
                        // Restore scratch
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << element;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"]";
                }
            } break;

            case Value::BOOLEAN: ss << (scratch.v.b ? U"true" : U"false"); break;

            case Value::NUMBER: ss << decode_utf8(jsonnet_unparse_number(scratch.v.d)); break;

            case Value::FUNCTION:
                throw makeError(loc, "couldn't manifest function in JSON output.");

            case Value::NULL_TYPE: ss << U"null"; break;

            case Value::OBJECT: {
                auto *obj = static_cast<HeapObject *>(scratch.v.h);
                runInvariants(loc, obj);
                // Using std::map has the useful side-effect of ordering the fields
                // alphabetically.
                std::map<UString, const Identifier *> fields;
                for (const auto &f : objectFields(obj, true)) {
                    fields[f->name] = f;
                }
                if (fields.size() == 0) {
                    ss << U"{ }";
                } else {
                    UString indent2 = multiline ? indent + U"   " : indent;
                    const char32_t *prefix = multiline ? U"{\n" : U"{";
                    for (const auto &f : fields) {
                        // pushes FRAME_CALL
                        const AST *body = objectIndex(loc, obj, f.second, 0);
                        stack.top().val = scratch;
                        evaluate(body, stack.size());
                        auto vstr = manifestJson(body->location, multiline, indent2);
                        // Reset scratch so that the object we're manifesting doesn't
                        // get GC'd.
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << jsonnet_string_unparse(f.first, false) << U": "
                           << vstr;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"}";
                }
            } break;

            case Value::STRING: {
                const UString &str = static_cast<HeapString *>(scratch.v.h)->value;
                ss << jsonnet_string_unparse(str, false);
            } break;
        }
        return ss.str();
    }